

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

bool proto2_unittest::TestParsingMerge::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  
  bVar1 = google::protobuf::internal::ExtensionSet::IsInitialized
                    ((ExtensionSet *)(msg + 1),(MessageLite *)_TestParsingMerge_default_instance_);
  if (bVar1) {
    bVar1 = (bool)((byte)msg[2]._internal_metadata_.ptr_ & 1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

PROTOBUF_NOINLINE bool TestParsingMerge::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const TestParsingMerge&>(msg);
  if (!this_._impl_._extensions_.IsInitialized(&default_instance())) {
    return false;
  }
  if (_Internal::MissingRequiredFields(this_._impl_._has_bits_)) {
    return false;
  }
  return true;
}